

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuMatrix.c
# Opt level: O1

void Fxu_MatrixDelLiteral(Fxu_Matrix *p,Fxu_Lit *pLit)

{
  Fxu_ListCubeDelLiteral(pLit->pCube,pLit);
  Fxu_ListVarDelLiteral(pLit->pVar,pLit);
  if (pLit != (Fxu_Lit *)0x0) {
    Fxu_MemRecycle(p,(char *)pLit,0x38);
  }
  p->nEntries = p->nEntries + -1;
  return;
}

Assistant:

void Fxu_MatrixDelLiteral( Fxu_Matrix * p, Fxu_Lit * pLit )
{
    // delete the literal
    Fxu_ListCubeDelLiteral( pLit->pCube, pLit );
    Fxu_ListVarDelLiteral( pLit->pVar, pLit );
    MEM_FREE_FXU( p, Fxu_Lit, 1, pLit );
    // increment the literal counter
    p->nEntries--;
}